

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  stbi_uc *__s;
  stbi_uc *__s_00;
  stbi_uc *psVar15;
  undefined4 in_register_0000000c;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint n;
  uint uVar22;
  uint uVar23;
  stbi_uc (*pal) [4];
  uint uVar24;
  size_t __size;
  uint uVar25;
  size_t __size_00;
  long in_FS_OFFSET;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar10 = stbi__gif_header(s,g,comp,0);
    if (iVar10 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar10 = g->w;
    iVar11 = g->h;
    iVar12 = stbi__mad3sizes_valid(4,iVar10,iVar11,0);
    if (iVar12 == 0) {
      pcVar17 = "too large";
      goto LAB_0011443c;
    }
    iVar11 = iVar11 * iVar10;
    __size = (size_t)(iVar11 * 4);
    __s = (stbi_uc *)malloc(__size);
    g->out = __s;
    __s_00 = (stbi_uc *)malloc(__size);
    g->background = __s_00;
    __size_00 = (size_t)iVar11;
    psVar15 = (stbi_uc *)malloc(__size_00);
    g->history = psVar15;
    pcVar17 = "outofmem";
    if ((__s == (stbi_uc *)0x0) || (psVar15 == (stbi_uc *)0x0 || __s_00 == (stbi_uc *)0x0))
    goto LAB_0011443c;
    memset(__s,0,__size);
    memset(__s_00,0,__size);
    memset(psVar15,0,__size_00);
  }
  else {
    uVar22 = (uint)g->eflags >> 2 & 7;
    uVar9 = g->h * g->w;
    uVar25 = uVar22;
    if (uVar22 == 3) {
      uVar25 = 2;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar25 = uVar22;
    }
    if (uVar25 == 3) {
      uVar16 = 0;
      uVar18 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar18 = uVar16;
      }
      for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        if (g->history[uVar16] != '\0') {
          *(undefined4 *)(g->out + uVar16 * 4) =
               *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar16 * 4);
        }
      }
    }
    else if (uVar25 == 2) {
      uVar16 = 0;
      uVar18 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar18 = uVar16;
      }
      for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
        if (g->history[uVar16] != '\0') {
          *(undefined4 *)(g->out + uVar16 * 4) = *(undefined4 *)(g->background + uVar16 * 4);
        }
      }
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar15 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar15,0,__size_00);
  pal = g->pal;
  while (sVar6 = stbi__get8(s), sVar6 == '!') {
    sVar6 = stbi__get8(s);
    if (sVar6 == 0xf9) {
      bVar7 = stbi__get8(s);
      if (bVar7 == 4) {
        bVar7 = stbi__get8(s);
        g->eflags = (uint)bVar7;
        iVar10 = stbi__get16le(s);
        g->delay = iVar10 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) == 0) {
          stbi__skip(s,1);
          g->transparent = -1;
        }
        else {
          bVar7 = stbi__get8(s);
          g->transparent = (uint)bVar7;
          g->pal[bVar7][3] = '\0';
        }
        goto LAB_00114316;
      }
      stbi__skip(s,(uint)bVar7);
    }
    else {
LAB_00114316:
      while (bVar7 = stbi__get8(s), bVar7 != 0) {
        stbi__skip(s,(uint)bVar7);
      }
    }
  }
  if (sVar6 == ';') {
    return (stbi_uc *)s;
  }
  if (sVar6 == ',') {
    iVar10 = stbi__get16le(s);
    iVar11 = stbi__get16le(s);
    iVar12 = stbi__get16le(s);
    iVar13 = stbi__get16le(s);
    pcVar17 = "bad Image Descriptor";
    if ((iVar12 + iVar10 <= g->w) && (iVar13 + iVar11 <= g->h)) {
      iVar19 = g->w * 4;
      g->line_size = iVar19;
      g->start_x = iVar10 << 2;
      g->start_y = iVar11 * iVar19;
      g->max_x = (iVar12 + iVar10) * 4;
      iVar13 = iVar19 * (iVar13 + iVar11);
      g->max_y = iVar13;
      g->cur_x = iVar10 << 2;
      if (iVar12 != 0) {
        iVar13 = iVar11 * iVar19;
      }
      g->cur_y = iVar13;
      bVar7 = stbi__get8(s);
      g->lflags = (uint)bVar7;
      iVar10 = g->line_size * 8;
      if ((bVar7 & 0x40) == 0) {
        iVar10 = g->line_size;
      }
      g->step = iVar10;
      g->parse = (int)((uint)bVar7 << 0x19) >> 0x1f & 3;
      if ((char)bVar7 < '\0') {
        pal = g->lpal;
        if ((g->eflags & 1) == 0) {
          iVar10 = -1;
        }
        else {
          iVar10 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar7 & 7),iVar10);
      }
      else if ((g->flags & 0x80) == 0) {
        pcVar17 = "missing color table";
        goto LAB_0011443c;
      }
      g->color_table = *pal;
      bVar7 = stbi__get8(s);
      if (0xc < bVar7) {
        return (stbi_uc *)0x0;
      }
      uVar25 = 1 << (bVar7 & 0x1f);
      for (uVar18 = 0; uVar25 != uVar18; uVar18 = uVar18 + 1) {
        g->codes[uVar18].prefix = -1;
        g->codes[uVar18].first = (stbi_uc)uVar18;
        g->codes[uVar18].suffix = (stbi_uc)uVar18;
      }
      uVar21 = (2 << (bVar7 & 0x1f)) - 1;
      n = 0;
      uVar22 = 0 << (bVar7 & 0x1f);
      iVar11 = 0;
      bVar3 = false;
      uVar4 = 0xffffffff;
      uVar5 = uVar25 + 2;
      iVar10 = bVar7 + 1;
      uVar9 = uVar21;
LAB_0011451d:
      do {
        for (; uVar14 = uVar9, iVar12 = iVar10, uVar20 = uVar5, uVar23 = uVar4, bVar2 = bVar3,
            iVar10 = iVar11 - iVar12, iVar11 < iVar12; iVar11 = iVar11 + 8) {
          if (n == 0) {
            bVar8 = stbi__get8(s);
            if (bVar8 == 0) goto LAB_0011467e;
            n = (uint)bVar8;
          }
          n = n - 1;
          bVar8 = stbi__get8(s);
          uVar22 = uVar22 | (uint)bVar8 << ((byte)iVar11 & 0x1f);
          bVar3 = bVar2;
          uVar4 = uVar23;
          uVar5 = uVar20;
          iVar10 = iVar12;
          uVar9 = uVar14;
        }
        uVar9 = (int)uVar22 >> ((byte)iVar12 & 0x1f);
        uVar24 = uVar22 & uVar14;
        uVar22 = uVar9;
        iVar11 = iVar10;
        bVar3 = true;
        uVar4 = 0xffffffff;
        uVar5 = uVar25 + 2;
        iVar10 = bVar7 + 1;
        uVar9 = uVar21;
      } while (uVar24 == uVar25);
      if (uVar24 == uVar25 + 1) {
        do {
          stbi__skip(s,n);
          bVar7 = stbi__get8(s);
          n = (uint)bVar7;
        } while (bVar7 != 0);
LAB_0011467e:
        psVar15 = g->out;
        if (psVar15 == (stbi_uc *)0x0) {
          return (stbi_uc *)0x0;
        }
        if (psVar1 == (stbi_uc *)0x0) {
          if (0 < g->bgindex) {
            uVar25 = g->h * g->w;
            uVar16 = 0;
            uVar18 = (ulong)uVar25;
            if ((int)uVar25 < 1) {
              uVar18 = uVar16;
            }
            for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
              if (g->history[uVar16] == '\0') {
                g->pal[g->bgindex][3] = 0xff;
                *(stbi_uc (*) [4])(g->out + uVar16 * 4) = g->pal[g->bgindex];
              }
            }
            return psVar15;
          }
          return psVar15;
        }
        return psVar15;
      }
      pcVar17 = "no clear code";
      if ((int)uVar20 < (int)uVar24) {
        pcVar17 = "illegal code in raster";
        goto LAB_0011443c;
      }
      if (!bVar2) goto LAB_0011443c;
      if ((int)uVar23 < 0) {
        if (uVar24 == uVar20) goto LAB_001146ef;
      }
      else {
        if (0x1fff < (int)uVar20) {
          pcVar17 = "too many codes";
          goto LAB_0011443c;
        }
        g->codes[(int)uVar20].prefix = (stbi__int16)uVar23;
        sVar6 = g->codes[uVar23].first;
        g->codes[(int)uVar20].first = sVar6;
        if (uVar24 != uVar20 + 1) {
          sVar6 = g->codes[(int)uVar24].first;
        }
        g->codes[(int)uVar20].suffix = sVar6;
        uVar20 = uVar20 + 1;
      }
      stbi__out_gif_code(g,(stbi__uint16)uVar24);
      iVar10 = iVar12 + 1;
      uVar9 = ~(-1 << ((byte)iVar10 & 0x1f));
      if (0xfff < (int)uVar20 || (uVar20 & uVar14) != 0) {
        uVar9 = uVar14;
        iVar10 = iVar12;
      }
      bVar3 = true;
      uVar4 = uVar24;
      uVar5 = uVar20;
      goto LAB_0011451d;
    }
  }
  else {
    pcVar17 = "unknown code";
  }
LAB_0011443c:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar17;
  return (stbi_uc *)0x0;
LAB_001146ef:
  pcVar17 = "illegal code in raster";
  goto LAB_0011443c;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}